

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void __thiscall
std::pmr::test_resource::test_resource
          (test_resource *this,string_view name,bool verbose,memory_resource *pmrp)

{
  test_resource_list *ptVar1;
  memory_resource *pmrp_local;
  bool verbose_local;
  test_resource *this_local;
  string_view name_local;
  
  memory_resource::memory_resource(&this->super_memory_resource);
  *(undefined ***)this = &PTR__test_resource_00109cb0;
  (this->m_name_)._M_len = name._M_len;
  (this->m_name_)._M_str = name._M_str;
  atomic<int>::atomic(&this->m_no_abort_flag_,0);
  atomic<int>::atomic(&this->m_quiet_flag_,0);
  atomic<int>::atomic(&this->m_verbose_flag_,verbose & 1);
  atomic<long_long>::atomic(&this->m_allocation_limit_,-1);
  atomic<long_long>::atomic(&this->m_allocations_,0);
  atomic<long_long>::atomic(&this->m_deallocations_,0);
  atomic<long_long>::atomic(&this->m_mismatches_,0);
  atomic<long_long>::atomic(&this->m_bounds_errors_,0);
  atomic<long_long>::atomic(&this->m_bad_deallocate_params_,0);
  atomic<long_long>::atomic(&this->m_blocks_in_use_,0);
  atomic<long_long>::atomic(&this->m_max_blocks_,0);
  atomic<long_long>::atomic(&this->m_total_blocks_,0);
  atomic<unsigned_long>::atomic(&this->m_bytes_in_use_,0);
  atomic<long_long>::atomic(&this->m_max_bytes_,0);
  atomic<unsigned_long>::atomic(&this->m_total_bytes_,0);
  atomic<unsigned_long>::atomic(&this->m_last_allocated_num_bytes_,0);
  atomic<unsigned_long>::atomic(&this->m_last_allocated_alignment_,0);
  atomic<void_*>::atomic(&this->m_last_allocated_address_,(__pointer_type)0x0);
  atomic<unsigned_long>::atomic(&this->m_last_deallocated_num_bytes_,0);
  atomic<unsigned_long>::atomic(&this->m_last_deallocated_alignment_,0);
  atomic<void_*>::atomic(&this->m_last_deallocated_address_,(__pointer_type)0x0);
  this->m_list_ = (test_resource_list *)0x0;
  *(undefined8 *)((long)&(this->m_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->m_lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mutex::mutex(&this->m_lock_);
  this->m_pmr_ = pmrp;
  ptVar1 = (test_resource_list *)memory_resource::allocate(this->m_pmr_,0x10,0x10);
  this->m_list_ = ptVar1;
  this->m_list_->d_head_p = (Link *)0x0;
  this->m_list_->d_tail_p = (Link *)0x0;
  return;
}

Assistant:

test_resource::test_resource(string_view      name,
                             bool             verbose,
                             memory_resource *pmrp)
: m_name_(name)
, m_verbose_flag_(verbose)
, m_pmr_(pmrp)
{
    m_list_ = (test_resource_list *)m_pmr_->allocate(
                                                   sizeof(test_resource_list));
    m_list_->d_head_p = nullptr;
    m_list_->d_tail_p = nullptr;
}